

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O1

void commit_h(uint8_t *digest,commitments_t *C,picnic_instance_t *params)

{
  uint capacity;
  uint rate;
  ulong uVar1;
  hash_context ctx;
  Keccak_HashInstance KStack_108;
  
  if (params->digest_size == ' ') {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  Keccak_HashInitialize(&KStack_108,rate,capacity,0,'\x1f');
  if (params->num_MPC_parties != '\0') {
    uVar1 = 0;
    do {
      Keccak_HashUpdate(&KStack_108,C->hashes[uVar1],(ulong)params->digest_size << 3);
      uVar1 = uVar1 + 1;
    } while (uVar1 < params->num_MPC_parties);
  }
  Keccak_HashFinal(&KStack_108,(BitSequence *)0x0);
  Keccak_HashSqueeze(&KStack_108,digest,(ulong)params->digest_size << 3);
  return;
}

Assistant:

static void commit_h(uint8_t* digest, const commitments_t* C, const picnic_instance_t* params) {
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    hash_update(&ctx, C->hashes[i], params->digest_size);
  }
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, params->digest_size);
  hash_clear(&ctx);
}